

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  float fVar1;
  undefined8 uVar2;
  LensElementInterface *pLVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar29;
  Float t;
  Float local_ac;
  float local_a4;
  Ray local_a0;
  Normal3f local_78;
  undefined1 local_68 [16];
  Ray *local_58;
  Image *local_50;
  undefined1 local_48 [16];
  undefined1 auVar26 [64];
  
  local_a0.o.super_Tuple3<pbrt::Point3,_float>.x = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_a0.o.super_Tuple3<pbrt::Point3,_float>.y = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_a0.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar26 = ZEXT1664(auVar24);
  local_a0.time = rCamera->time;
  local_a0.o.super_Tuple3<pbrt::Point3,_float>.z = -(rCamera->o).super_Tuple3<pbrt::Point3,_float>.z
  ;
  local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x =
       (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y =
       (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.y;
  local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z =
       -(rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_a0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  uVar8 = (this->elementInterfaces).nStored;
  uVar7 = (int)uVar8 - 1;
  local_58 = rOut;
  if ((int)uVar7 < 0) {
    local_ac = 1.0;
  }
  else {
    local_50 = &this->apertureImage;
    lVar11 = (ulong)uVar7 << 4;
    auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
    fVar29 = 0.0;
    uVar8 = (uVar8 & 0xffffffff) + 0xfffffffe;
    local_ac = 1.0;
    lVar9 = (ulong)uVar7 + 1;
    do {
      auVar27 = auVar26._0_16_;
      pLVar3 = (this->elementInterfaces).ptr;
      fVar29 = fVar29 - *(float *)((long)&pLVar3->thickness + lVar11);
      local_78.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      local_78.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      local_78.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      fVar15 = *(float *)((long)&pLVar3->curvatureRadius + lVar11);
      if ((fVar15 != 0.0) || (NAN(fVar15))) {
        local_68._0_4_ = fVar15;
        bVar6 = IntersectSphericalElement(fVar15,fVar29 + fVar15,&local_a0,&local_a4,&local_78);
        auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
        if (!bVar6) {
          return 0.0;
        }
        auVar27._8_8_ = 0;
        auVar27._0_4_ = local_a0.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar27._4_4_ = local_a0.o.super_Tuple3<pbrt::Point3,_float>.y;
        fVar15 = (float)local_68._0_4_;
      }
      else {
        local_a4 = (fVar29 - local_a0.o.super_Tuple3<pbrt::Point3,_float>.z) /
                   local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z;
        if (local_a4 < 0.0) {
          return 0.0;
        }
      }
      fVar22 = local_a0.o.super_Tuple3<pbrt::Point3,_float>.z +
               local_a4 * local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._8_8_ = 0;
      auVar13._0_4_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar13._4_4_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar4 = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar5 = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar25._0_4_ = auVar27._0_4_ + local_a4 * fVar4;
      auVar25._4_4_ = auVar27._4_4_ + local_a4 * fVar5;
      auVar25._8_4_ = auVar27._8_4_ + local_a4 * 0.0;
      auVar25._12_4_ = auVar27._12_4_ + local_a4 * 0.0;
      auVar26 = ZEXT1664(auVar25);
      if ((((fVar15 != 0.0) || (NAN(fVar15))) ||
          ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1)) ||
         ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
        fVar1 = *(float *)((long)&pLVar3->apertureRadius + lVar11);
        auVar16._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar16._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar16._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar16._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar24 = vmovshdup_avx(auVar16);
        auVar24 = vfmadd231ss_fma(auVar24,auVar25,auVar25);
        if (fVar1 * fVar1 < auVar24._0_4_) {
          return 0.0;
        }
        local_a0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar25);
        local_a0.o.super_Tuple3<pbrt::Point3,_float>.z = fVar22;
        if ((fVar15 != 0.0) || (NAN(fVar15))) {
          auVar27 = SUB6416(ZEXT464(0x3f800000),0);
          auVar24 = auVar27;
          if (lVar11 != 0) {
            fVar15 = (this->elementInterfaces).ptr[uVar8 & 0xffffffff].eta;
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              auVar24 = ZEXT416((uint)fVar15);
            }
          }
          auVar21._0_4_ = fVar4 * fVar4;
          auVar21._4_4_ = fVar5 * fVar5;
          auVar21._8_8_ = 0;
          fVar15 = auVar24._0_4_ / *(float *)((long)&pLVar3->eta + lVar11);
          auVar24 = vmovshdup_avx(auVar21);
          auVar24 = vfmadd231ss_fma(auVar24,auVar13,auVar13);
          auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)local_a0.d.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar17._0_4_ = -local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar17._4_4_ = 0x80000000;
          auVar17._8_4_ = 0x80000000;
          auVar17._12_4_ = 0x80000000;
          auVar14._0_8_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          auVar14._8_4_ = 0x80000000;
          auVar14._12_4_ = 0x80000000;
          auVar24 = vsqrtss_avx(auVar24,auVar24);
          fVar22 = auVar24._0_4_;
          auVar12._0_4_ = auVar17._0_4_ / fVar22;
          auVar12._4_12_ = auVar17._4_12_;
          auVar18._4_4_ = fVar22;
          auVar18._0_4_ = fVar22;
          auVar18._8_4_ = fVar22;
          auVar18._12_4_ = fVar22;
          auVar24 = vdivps_avx(auVar14,auVar18);
          auVar19._8_8_ = 0;
          auVar19._0_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.x;
          auVar19._4_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar13 = vmovshdup_avx(auVar19);
          auVar25 = vmovshdup_avx(auVar24);
          auVar13 = vfmadd213ss_fma(auVar13,auVar25,
                                    ZEXT416((uint)(local_78.super_Tuple3<pbrt::Normal3,_float>.z *
                                                  auVar12._0_4_)));
          auVar25 = vfmsub231ss_fma(ZEXT416((uint)(local_78.super_Tuple3<pbrt::Normal3,_float>.z *
                                                  auVar12._0_4_)),
                                    ZEXT416((uint)local_78.super_Tuple3<pbrt::Normal3,_float>.z),
                                    auVar12);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar25._0_4_)),auVar19,auVar24);
          auVar27 = vfnmadd213ss_fma(auVar13,auVar13,auVar27);
          auVar27 = vmaxss_avx(auVar27,auVar28._0_16_);
          fVar22 = auVar27._0_4_ / (fVar15 * fVar15);
          if (1.0 <= fVar22) {
            return 0.0;
          }
          auVar23._4_4_ = fVar15;
          auVar23._0_4_ = fVar15;
          auVar23._8_4_ = fVar15;
          auVar23._12_4_ = fVar15;
          auVar24 = vdivps_avx(auVar24,auVar23);
          auVar27 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar22)),auVar28._0_16_);
          auVar27 = vsqrtss_avx(auVar27,auVar27);
          fVar22 = auVar13._0_4_ / fVar15 - auVar27._0_4_;
          auVar20._0_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.x * fVar22;
          auVar20._4_4_ = local_78.super_Tuple3<pbrt::Normal3,_float>.y * fVar22;
          auVar20._8_4_ = fVar22 * 0.0;
          auVar20._12_4_ = fVar22 * 0.0;
          local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z =
               local_78.super_Tuple3<pbrt::Normal3,_float>.z * fVar22 - auVar12._0_4_ / fVar15;
          auVar24 = vsubps_avx(auVar20,auVar24);
          local_a0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar24);
        }
      }
      else {
        fVar15 = *(float *)((long)&pLVar3->apertureRadius + lVar11);
        auVar24 = vmovshdup_avx(auVar25);
        local_48 = ZEXT416((uint)fVar22);
        auVar24 = vinsertps_avx(ZEXT416((uint)((auVar25._0_4_ / fVar15 + 1.0) * 0.5)),
                                ZEXT416((uint)(1.0 - (auVar24._0_4_ / fVar15 + 1.0) * 0.5)),0x10);
        local_68 = auVar25;
        local_ac = Image::BilerpChannel(local_50,(Point2f)auVar24._0_8_,0,(WrapMode2D)0x100000001);
        auVar26 = ZEXT1664(local_68);
        auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
        if ((local_ac == 0.0) && (!NAN(local_ac))) {
          return 0.0;
        }
        local_a0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(local_68);
        local_a0.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_48._0_4_;
      }
      auVar24 = auVar26._0_16_;
      uVar8 = uVar8 - 1;
      lVar11 = lVar11 + -0x10;
      lVar10 = lVar9 + -1;
      bVar6 = 0 < lVar9;
      lVar9 = lVar10;
    } while (lVar10 != 0 && bVar6);
  }
  if (local_58 != (Ray *)0x0) {
    uVar2 = vmovlps_avx(auVar24);
    (local_58->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
    (local_58->o).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
    (local_58->o).super_Tuple3<pbrt::Point3,_float>.z =
         -local_a0.o.super_Tuple3<pbrt::Point3,_float>.z;
    (local_58->d).super_Tuple3<pbrt::Vector3,_float>.x =
         local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (local_58->d).super_Tuple3<pbrt::Vector3,_float>.y =
         local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y;
    (local_58->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_58->time = local_a0.time;
    (local_58->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return local_ac;
}

Assistant:

Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            uv.y = 1 - uv.y;
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
            if (r2 > element.apertureRadius * element.apertureRadius)
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}